

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O1

void dsa_freekey(ssh_key *key)

{
  if (key[-5].vt != (ssh_keyalg *)0x0) {
    mp_free((mp_int *)key[-5].vt);
  }
  if (key[-4].vt != (ssh_keyalg *)0x0) {
    mp_free((mp_int *)key[-4].vt);
  }
  if (key[-3].vt != (ssh_keyalg *)0x0) {
    mp_free((mp_int *)key[-3].vt);
  }
  if (key[-2].vt != (ssh_keyalg *)0x0) {
    mp_free((mp_int *)key[-2].vt);
  }
  if (key[-1].vt != (ssh_keyalg *)0x0) {
    mp_free((mp_int *)key[-1].vt);
  }
  safefree(key + -5);
  return;
}

Assistant:

static void dsa_freekey(ssh_key *key)
{
    struct dsa_key *dsa = container_of(key, struct dsa_key, sshk);
    if (dsa->p)
        mp_free(dsa->p);
    if (dsa->q)
        mp_free(dsa->q);
    if (dsa->g)
        mp_free(dsa->g);
    if (dsa->y)
        mp_free(dsa->y);
    if (dsa->x)
        mp_free(dsa->x);
    sfree(dsa);
}